

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

bool tinyexr::CalculateNumTiles
               (vector<int,_std::allocator<int>_> *numTiles,int toplevel_size,int size,
               int tile_rounding_mode)

{
  pointer piVar1;
  uint uVar2;
  uint level;
  ulong uVar3;
  ulong uVar4;
  
  piVar1 = (numTiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  uVar3 = (long)(numTiles->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
  for (level = 0; uVar4 = (ulong)level, uVar4 < uVar3; level = level + 1) {
    uVar2 = LevelSize(toplevel_size,level,tile_rounding_mode);
    if (((int)uVar2 < 0) || (0x80000000U - size < uVar2)) break;
    piVar1[uVar4] = (int)(uVar2 + size + -1) / size;
  }
  return uVar3 <= uVar4;
}

Assistant:

static bool CalculateNumTiles(std::vector<int>& numTiles,
  int toplevel_size,
  int size,
  int tile_rounding_mode) {
  for (unsigned i = 0; i < numTiles.size(); i++) {
    int l = LevelSize(toplevel_size, int(i), tile_rounding_mode);
    if (l < 0) {
      return false;
    }
    TINYEXR_CHECK_AND_RETURN_C(l <= std::numeric_limits<int>::max() - size + 1, false);

    numTiles[i] = (l + size - 1) / size;
  }
  return true;
}